

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 floatx80_div_m68k(floatx80 a,floatx80 b,float_status *status)

{
  ushort uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t zSig1;
  uint uVar15;
  uint32_t aLow;
  ulong uVar16;
  bool bVar17;
  floatx80 fVar18;
  flag local_3c;
  
  uVar16 = b.low;
  uVar8 = a.low;
  uVar10 = CONCAT71(b.low._1_7_,-1 < (long)uVar8);
  uVar1 = a.high & 0x7fff;
  if (-1 < (long)uVar8 && ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0)
  {
LAB_006c8eda:
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar18._10_6_ = (int6)(uVar10 >> 0x10);
    fVar18.high = 0x7fff;
    fVar18.low = 0xffffffffffffffff;
    return fVar18;
  }
  uVar10 = CONCAT71(b.low._1_7_,-1 < (long)uVar16);
  uVar11 = b.high & 0x7fff;
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar16
     ) goto LAB_006c8eda;
  uVar15 = (uint)uVar1;
  uVar4 = b._8_4_ ^ a._8_4_;
  uVar10 = (ulong)uVar4;
  if (uVar1 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0) {
LAB_006c8f5b:
      fVar18 = propagateFloatx80NaN_m68k(a,b,status);
      return fVar18;
    }
    if (uVar11 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
      goto LAB_006c8eda;
      goto LAB_006c8f5b;
    }
  }
  else {
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
      uVar12 = (uint)uVar11;
      if (uVar11 == 0x7fff) {
        if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)
        goto LAB_006c8f5b;
      }
      else {
LAB_006c8f88:
        if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
LAB_006c8faa:
          uVar10 = 0;
          if (uVar16 <= uVar8) {
            uVar10 = uVar8 << 0x3f;
          }
          uVar9 = uVar8 >> (uVar16 <= uVar8);
          uVar7 = uVar16 >> 0x20;
          if (uVar9 < uVar16) {
            uVar13 = 0xffffffff00000000;
            if (uVar9 < (uVar16 & 0xffffffff00000000)) {
              uVar13 = uVar9 / uVar7 << 0x20;
            }
            uVar6 = (uVar13 >> 0x20) * (uVar16 & 0xffffffff);
            uVar2 = uVar13 * uVar16;
            uVar5 = uVar10 - uVar2;
            lVar3 = ((uVar9 - ((uVar6 >> 0x20) + (uVar13 >> 0x20) * uVar7)) -
                    (ulong)(uVar10 < uVar2)) - (ulong)(uVar2 < uVar6 << 0x20);
            if (lVar3 < 0) {
              uVar2 = (0x100000000 - uVar13) * uVar16 + uVar10;
              uVar6 = uVar5;
              do {
                uVar13 = uVar13 - 0x100000000;
                uVar5 = uVar6 + (uVar16 << 0x20);
                bVar17 = uVar2 < uVar6;
                uVar2 = uVar2 + (uVar16 << 0x20);
                lVar3 = lVar3 + uVar7 + (ulong)bVar17;
                uVar6 = uVar5;
              } while (lVar3 < 0);
            }
            uVar2 = uVar5 >> 0x20 | lVar3 << 0x20;
            uVar5 = 0xffffffff;
            if (uVar2 < (uVar16 & 0xffffffff00000000)) {
              uVar5 = uVar2 / uVar7;
            }
            uVar5 = uVar5 | uVar13;
          }
          else {
            uVar5 = 0xffffffffffffffff;
          }
          uVar2 = uVar16 & 0xffffffff;
          uVar13 = (uVar5 >> 0x20) * uVar2;
          uVar6 = (uVar5 & 0xffffffff) * uVar7;
          lVar3 = 0;
          uVar14 = uVar6 + uVar13;
          if (CARRY8(uVar6,uVar13)) {
            lVar3 = -0x100000000;
          }
          uVar6 = uVar5 * uVar16;
          uVar13 = uVar10 - uVar6;
          lVar3 = (((uVar9 - (uVar10 < uVar6)) - ((uVar14 >> 0x20) + (uVar5 >> 0x20) * uVar7)) +
                  lVar3) - (ulong)(uVar6 < uVar14 << 0x20);
          if (lVar3 < 0) {
            uVar10 = uVar10 + (1 - uVar5) * uVar16;
            uVar9 = uVar13;
            do {
              uVar5 = uVar5 - 1;
              uVar13 = uVar9 + uVar16;
              bVar17 = uVar10 < uVar9;
              uVar10 = uVar10 + uVar16;
              lVar3 = lVar3 + (ulong)bVar17;
              uVar9 = uVar13;
            } while (lVar3 < 0);
          }
          zSig1 = 0xffffffffffffffff;
          if (uVar13 < uVar16) {
            uVar10 = 0xffffffff00000000;
            if (uVar13 < (uVar16 & 0xffffffff00000000)) {
              uVar10 = uVar13 / uVar7 << 0x20;
            }
            uVar14 = (uVar10 >> 0x20) * uVar2;
            uVar6 = uVar10 * uVar16;
            uVar9 = -uVar6;
            lVar3 = ((uVar13 - ((uVar14 >> 0x20) + (uVar10 >> 0x20) * uVar7)) - (ulong)(uVar6 != 0))
                    - (ulong)(uVar6 < uVar14 << 0x20);
            if (lVar3 < 0) {
              uVar6 = (0x100000000 - uVar10) * uVar16;
              uVar14 = uVar9;
              do {
                uVar10 = uVar10 - 0x100000000;
                uVar9 = uVar14 + (uVar16 << 0x20);
                bVar17 = uVar6 < uVar14;
                uVar6 = uVar6 + (uVar16 << 0x20);
                lVar3 = lVar3 + uVar7 + (ulong)bVar17;
                uVar14 = uVar9;
              } while (lVar3 < 0);
            }
            uVar9 = uVar9 >> 0x20 | lVar3 << 0x20;
            uVar6 = 0xffffffff;
            if (uVar9 < (uVar16 & 0xffffffff00000000)) {
              uVar6 = uVar9 / uVar7;
            }
            zSig1 = uVar6 | uVar10;
            if (zSig1 * 2 < 9) {
              uVar2 = uVar2 * (zSig1 >> 0x20);
              uVar10 = (uVar6 & 0xffffffff) * uVar7;
              lVar3 = 0;
              uVar9 = uVar10 + uVar2;
              if (CARRY8(uVar10,uVar2)) {
                lVar3 = -0x100000000;
              }
              uVar2 = zSig1 * uVar16;
              uVar10 = -uVar2;
              lVar3 = (((uVar13 - (uVar2 != 0)) - ((uVar9 >> 0x20) + (zSig1 >> 0x20) * uVar7)) +
                      lVar3) - (ulong)(uVar2 < uVar9 << 0x20);
              if (lVar3 < 0) {
                uVar7 = (1 - zSig1) * uVar16;
                do {
                  zSig1 = zSig1 - 1;
                  bVar17 = uVar7 < uVar10;
                  uVar10 = uVar10 + uVar16;
                  uVar7 = uVar7 + uVar16;
                  lVar3 = lVar3 + (ulong)bVar17;
                } while (lVar3 < 0);
                lVar3 = 0;
              }
              zSig1 = zSig1 | (lVar3 != 0 || uVar10 != 0);
            }
          }
          local_3c = (flag)((uVar4 & 0xffff) >> 0xf);
          fVar18 = roundAndPackFloatx80_m68k
                             (status->floatx80_rounding_precision,local_3c,
                              (uint)(uVar16 <= uVar8) + (uVar15 - uVar12) + 0x3ffe,uVar5,zSig1,
                              status);
          return fVar18;
        }
        if (uVar8 != 0) {
          uVar10 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> uVar10 == 0; uVar10 = uVar10 - 1) {
            }
          }
          uVar8 = uVar8 << ((byte)(uVar10 ^ 0x3f) & 0x3f);
          uVar15 = 1 - (int)(uVar10 ^ 0x3f);
          goto LAB_006c8faa;
        }
      }
      uVar4 = uVar4 & 0x8000;
      goto LAB_006c9078;
    }
    if (uVar16 != 0) {
      uVar10 = 0x3f;
      if (uVar16 != 0) {
        for (; uVar16 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar16 = uVar16 << ((byte)(uVar10 ^ 0x3f) & 0x3f);
      uVar12 = 1 - (int)(uVar10 ^ 0x3f);
      goto LAB_006c8f88;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 && uVar8 == 0)
    goto LAB_006c8eda;
    status->float_exception_flags = status->float_exception_flags | 4;
  }
  uVar4 = uVar4 | 0x7fff;
LAB_006c9078:
  return (floatx80)(ZEXT416(uVar4) << 0x40);
}

Assistant:

floatx80 floatx80_div(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    uint64_t rem0, rem1, rem2, term0, term1, term2;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    bSign = extractFloatx80Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if ((uint64_t)(bSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return packFloatx80( zSign, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            if ( ( aExp | aSig ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return floatx80_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(zSign, floatx80_infinity_high,
                                       floatx80_infinity_low);
        }
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
    }
    zExp = aExp - bExp + 0x3FFE;
    rem1 = 0;
    if ( bSig <= aSig ) {
        shift128Right( aSig, 0, 1, &aSig, &rem1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig, rem1, bSig );
    mul64To128( bSig, zSig0, &term0, &term1 );
    sub128( aSig, rem1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add128( rem0, rem1, 0, bSig, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, bSig );
    if ( (uint64_t) ( zSig1<<1 ) <= 8 ) {
        mul64To128( bSig, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add128( rem1, rem2, 0, bSig, &rem1, &rem2 );
        }
        zSig1 |= ( ( rem1 | rem2 ) != 0 );
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}